

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O1

void __thiscall TileSwitch::setCharID(TileSwitch *this,char charID)

{
  _Hash_node_base *p_Var1;
  iterator __position;
  Board *pBVar2;
  __node_base_ptr p_Var3;
  vector<TileSwitch*,std::allocator<TileSwitch*>> *this_00;
  mapped_type *this_01;
  size_t __n;
  _Hash_node_base *__dest;
  ulong __code;
  _Hash_node_base *p_Var4;
  char local_79;
  locale local_78 [8];
  undefined1 local_70 [32];
  string local_50;
  key_type local_30;
  
  local_79 = charID;
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  __code = (ulong)(char)(this->super_Tile).field_0x21;
  p_Var4 = (_Hash_node_base *)0x0;
  p_Var3 = std::
           _Hashtable<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(pBVar2->switchKeybinds)._M_h,
                      __code % (pBVar2->switchKeybinds)._M_h._M_bucket_count,
                      &(this->super_Tile).field_0x21,__code);
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var4 = p_Var3->_M_nxt;
  }
  __dest = p_Var4[2]._M_nxt;
  p_Var1 = p_Var4[3]._M_nxt;
  if (__dest != p_Var1) {
    __n = (long)p_Var1 - (long)__dest;
    do {
      __n = __n - 8;
      if ((TileSwitch *)__dest->_M_nxt == this) {
        if (__dest + 1 != p_Var1) {
          memmove(__dest,__dest + 1,__n);
        }
        p_Var4[3]._M_nxt = p_Var4[3]._M_nxt + -1;
        break;
      }
      __dest = __dest + 1;
    } while (__dest != p_Var1);
  }
  (this->super_Tile).field_0x21 = local_79;
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  this_00 = (vector<TileSwitch*,std::allocator<TileSwitch*>> *)
            std::__detail::
            _Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&pBVar2->switchKeybinds,&local_79);
  __position._M_current = *(TileSwitch ***)(this_00 + 8);
  local_70._0_8_ = this;
  if (__position._M_current == *(TileSwitch ***)(this_00 + 0x10)) {
    std::vector<TileSwitch*,std::allocator<TileSwitch*>>::_M_realloc_insert<TileSwitch*>
              (this_00,__position,(TileSwitch **)local_70);
  }
  else {
    *__position._M_current = this;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  local_30 = &this->super_Tile;
  this_01 = std::__detail::
            _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&pBVar2->tileLabels,&local_30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
  std::locale::locale(local_78);
  sf::String::String((String *)local_70,&local_50,local_78);
  sf::Text::setString(this_01,(String *)local_70);
  if ((TileSwitch *)local_70._0_8_ != (TileSwitch *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  std::locale::~locale(local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (*(this->super_Tile)._vptr_Tile[8])(this,1,0);
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  pBVar2->changesMade = true;
  return;
}

Assistant:

void TileSwitch::setCharID(char charID) {
    auto mapIter = getBoardPtr()->switchKeybinds.find(_charID);
    for (auto vectorIter = mapIter->second.begin(); vectorIter != mapIter->second.end(); ++vectorIter) {
        if (*vectorIter == this) {
            mapIter->second.erase(vectorIter);
            break;
        }
    }
    _charID = charID;
    getBoardPtr()->switchKeybinds[charID].push_back(this);
    getBoardPtr()->tileLabels[this].setString(string(1, charID));
    addUpdate(true);
    getBoardPtr()->changesMade = true;
}